

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
(anonymous_namespace)::GetOSReleaseVariables_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,cmExecutionStatus *status)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  undefined8 uVar1;
  bool bVar2;
  byte bVar3;
  cmMakefile *this_00;
  string *psVar4;
  char *pcVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  iterator iVar7;
  iterator iVar8;
  static_string_view sVar9;
  string_view sVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6f8;
  undefined1 local_5d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  string local_5b0;
  string_view local_590;
  string_view local_580;
  undefined1 local_570 [8];
  string value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *variable;
  iterator __end2;
  iterator __begin2;
  cmList *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  iterator local_500;
  size_type local_4f8;
  undefined1 local_4f0 [8];
  cmList variables;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *script;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  undefined1 local_4b0 [8];
  string result_variable;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_470;
  const_iterator local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_450;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_448;
  const_iterator local_440;
  iterator iStack_430;
  anon_class_1_0_00000001_for__M_pred checkName;
  allocator<char> local_421;
  string local_420;
  string *local_400;
  undefined1 local_3f8 [8];
  string findExpr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  scripts;
  Glob gl;
  undefined1 local_350 [8];
  optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  kv;
  string line;
  ifstream fin;
  string local_e0;
  string *local_c0;
  string *filename;
  static_string_view name;
  const_iterator __end1;
  const_iterator __begin1;
  char *local_90;
  string_view local_88;
  initializer_list<cm::static_string_view> local_78;
  initializer_list<cm::static_string_view> *local_68;
  initializer_list<cm::static_string_view> *__range1;
  allocator<char> local_49;
  string local_48;
  string *local_28;
  string *sysroot;
  cmMakefile *makefile;
  cmExecutionStatus *status_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *data;
  
  makefile = (cmMakefile *)this;
  status_local = (cmExecutionStatus *)__return_storage_ptr__;
  this_00 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)this);
  sysroot = (string *)this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"CMAKE_SYSROOT",&local_49);
  psVar4 = cmMakefile::GetSafeDefinition(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  __range1._3_1_ = 0;
  local_28 = psVar4;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(__return_storage_ptr__);
  sVar9 = ::cm::operator____s("/etc/os-release",0xf);
  local_90 = sVar9.super_string_view._M_str;
  __begin1 = (const_iterator)sVar9.super_string_view._M_len;
  local_88 = (string_view)::cm::operator____s("/usr/lib/os-release",0x13);
  local_78._M_array = (iterator)&__begin1;
  local_78._M_len = 2;
  local_68 = &local_78;
  __end1 = std::initializer_list<cm::static_string_view>::begin(local_68);
  name.super_string_view._M_str =
       (char *)std::initializer_list<cm::static_string_view>::end(local_68);
  for (; __end1 != (const_iterator)name.super_string_view._M_str; __end1 = __end1 + 1) {
    filename = (string *)(__end1->super_string_view)._M_len;
    name.super_string_view._M_len = (size_t)(__end1->super_string_view)._M_str;
    cmStrCat<std::__cxx11::string_const&,cm::static_string_view&>
              (&local_e0,local_28,(static_string_view *)&filename);
    local_c0 = &local_e0;
    bVar2 = cmsys::SystemTools::FileExists(local_c0);
    if (bVar2) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream((void *)((long)&line.field_2 + 8),pcVar5,_S_in);
      std::__cxx11::string::string
                ((string *)
                 &kv.
                  super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_engaged);
      while( true ) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)((long)&line.field_2 + 8),
                   (string *)
                   &kv.
                    super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_engaged);
        bVar3 = std::ios::fail();
        if (((bVar3 ^ 0xff) & 1) == 0) break;
        anon_unknown.dwarf_cf9f24::ParseOSReleaseLine
                  ((optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_350,
                   (string *)
                   &kv.
                    super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_engaged);
        bVar2 = std::
                optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::has_value((optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_350);
        if (bVar2) {
          __args = std::
                   optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::value((optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_350);
          std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<std::pair<std::__cxx11::string,std::__cxx11::string>&>
                    ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)__return_storage_ptr__,__args);
        }
        std::
        optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~optional((optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_350);
      }
      std::__cxx11::string::~string
                ((string *)
                 &kv.
                  super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_engaged);
      bVar2 = true;
      std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
    }
    else {
      bVar2 = false;
    }
    std::__cxx11::string::~string((string *)&local_e0);
    if (bVar2) break;
  }
  bVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(__return_storage_ptr__);
  if (bVar2) {
    cmsys::Glob::Glob((Glob *)&scripts.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&findExpr.field_2 + 8));
    psVar4 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
    cmStrCat<std::__cxx11::string_const&,char_const(&)[36]>
              ((string *)local_3f8,psVar4,(char (*) [36])"/Modules/Internal/OSRelease/*.cmake");
    bVar2 = cmsys::Glob::FindFiles
                      ((Glob *)&scripts.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (string *)local_3f8,(GlobMessages *)0x0);
    if (bVar2) {
      pvVar6 = cmsys::Glob::GetFiles_abi_cxx11_
                         ((Glob *)&scripts.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&findExpr.field_2 + 8),pvVar6);
    }
    psVar4 = sysroot;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,"CMAKE_GET_OS_RELEASE_FALLBACK_SCRIPTS",&local_421);
    local_400 = (string *)cmMakefile::GetDefinition((cmMakefile *)psVar4,&local_420);
    iStack_430 = cmList::append((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)((long)&findExpr.field_2 + 8),(cmValue)local_400,No);
    std::__cxx11::string::~string((string *)&local_420);
    std::allocator<char>::~allocator(&local_421);
    pvVar6 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&findExpr.field_2 + 8);
    local_450 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(pvVar6);
    local_458 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(pvVar6);
    local_448 = std::
                remove_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(anonymous_namespace)::GetOSReleaseVariables(cmExecutionStatus&)::__0>
                          (local_450,local_458);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_440,&local_448);
    pvVar6 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&findExpr.field_2 + 8);
    local_470._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(pvVar6);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_468,&local_470);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(pvVar6,local_440,local_468);
    pvVar6 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&findExpr.field_2 + 8);
    iVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin(pvVar6);
    iVar8 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(pvVar6);
    std::
    sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,(anonymous_namespace)::GetOSReleaseVariables(cmExecutionStatus&)::__1>
              (iVar7._M_current,iVar8._M_current);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_4b0,"CMAKE_GET_OS_RELEASE_FALLBACK_RESULT",
               (allocator<char> *)((long)&__range1_1 + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
    pvVar6 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&findExpr.field_2 + 8);
    __end1_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar6);
    script = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(pvVar6);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1_1,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&script);
      if (!bVar2) break;
      variables.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           __gnu_cxx::
           __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1_1);
      cmMakefile::RemoveDefinition((cmMakefile *)sysroot,(string *)local_4b0);
      bVar2 = cmMakefile::ReadListFile
                        ((cmMakefile *)sysroot,
                         variables.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        bVar2 = cmSystemTools::GetErrorOccurredFlag();
        if (!bVar2) {
          local_528 = &local_520;
          __range2 = (cmList *)cmMakefile::GetDefinition((cmMakefile *)sysroot,(string *)local_4b0);
          psVar4 = cmValue::operator_cast_to_string_((cmValue *)&__range2);
          std::__cxx11::string::string((string *)&local_520,(string *)psVar4);
          local_500 = &local_520;
          local_4f8 = 1;
          init._M_len = 1;
          init._M_array = local_500;
          cmList::cmList((cmList *)local_4f0,init);
          local_6f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_500;
          do {
            local_6f8 = local_6f8 + -1;
            std::__cxx11::string::~string((string *)local_6f8);
          } while (local_6f8 != &local_520);
          bVar2 = cmList::empty((cmList *)local_4f0);
          if (bVar2) {
            gl._84_4_ = 7;
          }
          else {
            __end2 = cmList::begin_abi_cxx11_((cmList *)local_4f0);
            variable = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       cmList::end_abi_cxx11_((cmList *)local_4f0);
            while( true ) {
              bVar2 = __gnu_cxx::operator!=
                                (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          *)&variable);
              if (!bVar2) break;
              value.field_2._8_8_ =
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2);
              psVar4 = cmMakefile::GetSafeDefinition
                                 ((cmMakefile *)sysroot,(string *)value.field_2._8_8_);
              std::__cxx11::string::string((string *)local_570,(string *)psVar4);
              cmMakefile::RemoveDefinition((cmMakefile *)sysroot,(string *)value.field_2._8_8_);
              sVar10 = (string_view)
                       std::__cxx11::string::operator_cast_to_basic_string_view
                                 ((string *)value.field_2._8_8_);
              key.field_2._M_local_buf[0xf] = '_';
              local_580 = sVar10;
              cmStrCat<std::__cxx11::string_const&,char>
                        (&local_5b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b0,key.field_2._M_local_buf + 0xf);
              sVar10 = (string_view)
                       std::__cxx11::string::operator_cast_to_basic_string_view
                                 ((string *)&local_5b0);
              local_590 = sVar10;
              bVar2 = cmHasPrefix(local_580,sVar10);
              std::__cxx11::string::~string((string *)&local_5b0);
              uVar1 = value.field_2._8_8_;
              if (((bVar2 ^ 0xffU) & 1) == 0) {
                std::__cxx11::string::size();
                std::__cxx11::string::size();
                std::__cxx11::string::size();
                std::__cxx11::string::substr((ulong)local_5d8,uVar1);
                std::
                map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::emplace<std::__cxx11::string,std::__cxx11::string>
                          ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                            *)__return_storage_ptr__,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_5d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_570);
                std::__cxx11::string::~string((string *)local_5d8);
              }
              std::__cxx11::string::~string((string *)local_570);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end2);
            }
            bVar2 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::empty(__return_storage_ptr__);
            if (bVar2) {
              gl._84_4_ = 0;
            }
            else {
              std::
              map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::emplace<char_const(&)[21],std::__cxx11::string_const&>
                        ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)__return_storage_ptr__,(char (*) [21])"USED_FALLBACK_SCRIPT",
                         variables.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
              gl._84_4_ = 6;
            }
          }
          cmList::~cmList((cmList *)local_4f0);
          if ((gl._84_4_ != 0) && (gl._84_4_ == 6)) break;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1_1);
    }
    cmMakefile::RemoveDefinition((cmMakefile *)sysroot,(string *)local_4b0);
    __range1._3_1_ = 1;
    std::__cxx11::string::~string((string *)local_4b0);
    std::__cxx11::string::~string((string *)local_3f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&findExpr.field_2 + 8));
    cmsys::Glob::~Glob((Glob *)&scripts.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    __range1._3_1_ = 1;
  }
  if ((__range1._3_1_ & 1) == 0) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::string> GetOSReleaseVariables(
  cmExecutionStatus& status)
{
  auto& makefile = status.GetMakefile();
  const auto& sysroot = makefile.GetSafeDefinition("CMAKE_SYSROOT");

  std::map<std::string, std::string> data;
  // Based on
  // https://www.freedesktop.org/software/systemd/man/latest/os-release.html
  for (auto name : { "/etc/os-release"_s, "/usr/lib/os-release"_s }) {
    const auto& filename = cmStrCat(sysroot, name);
    if (cmSystemTools::FileExists(filename)) {
      cmsys::ifstream fin(filename.c_str());
      for (std::string line; !std::getline(fin, line).fail();) {
        auto kv = ParseOSReleaseLine(line);
        if (kv.has_value()) {
          data.emplace(kv.value());
        }
      }
      break;
    }
  }
  // Got smth?
  if (!data.empty()) {
    return data;
  }

  // Ugh, it could be some pre-os-release distro.
  // Lets try some fallback getters.
  // See also:
  //  - http://linuxmafia.com/faq/Admin/release-files.html

  // 1. CMake provided
  cmsys::Glob gl;
  std::vector<std::string> scripts;
  auto const findExpr = cmStrCat(cmSystemTools::GetCMakeRoot(),
                                 "/Modules/Internal/OSRelease/*.cmake");
  if (gl.FindFiles(findExpr)) {
    scripts = gl.GetFiles();
  }

  // 2. User provided (append to the CMake prvided)
  cmList::append(
    scripts, makefile.GetDefinition("CMAKE_GET_OS_RELEASE_FALLBACK_SCRIPTS"));

  // Filter out files that are not in format `NNN-name.cmake`
  auto checkName = [](std::string const& filepath) -> bool {
    auto const& filename = cmSystemTools::GetFilenameName(filepath);
    // NOTE Minimum filename length expected:
    //   NNN-<at-least-one-char-name>.cmake  --> 11
    return (filename.size() < 11) || !std::isdigit(filename[0]) ||
      !std::isdigit(filename[1]) || !std::isdigit(filename[2]) ||
      filename[3] != '-';
  };
  scripts.erase(std::remove_if(scripts.begin(), scripts.end(), checkName),
                scripts.end());

  // Make sure scripts are running in desired order
  std::sort(scripts.begin(), scripts.end(),
            [](std::string const& lhs, std::string const& rhs) -> bool {
              long lhs_order;
              cmStrToLong(cmSystemTools::GetFilenameName(lhs).substr(0u, 3u),
                          &lhs_order);
              long rhs_order;
              cmStrToLong(cmSystemTools::GetFilenameName(rhs).substr(0u, 3u),
                          &rhs_order);
              return lhs_order < rhs_order;
            });

  // Name of the variable to put the results
  std::string const result_variable{ "CMAKE_GET_OS_RELEASE_FALLBACK_RESULT" };

  for (auto const& script : scripts) {
    // Unset the result variable
    makefile.RemoveDefinition(result_variable);

    // include FATAL_ERROR and ERROR in the return status
    if (!makefile.ReadListFile(script) ||
        cmSystemTools::GetErrorOccurredFlag()) {
      // Ok, no worries... go try the next script.
      continue;
    }

    cmList variables{ makefile.GetDefinition(result_variable) };
    if (variables.empty()) {
      // Heh, this script didn't found anything... go try the next one.
      continue;
    }

    for (auto const& variable : variables) {
      auto value = makefile.GetSafeDefinition(variable);
      makefile.RemoveDefinition(variable);

      if (!cmHasPrefix(variable, cmStrCat(result_variable, '_'))) {
        // Ignore unknown variable set by the script
        continue;
      }

      auto key = variable.substr(result_variable.size() + 1,
                                 variable.size() - result_variable.size() - 1);
      data.emplace(std::move(key), std::move(value));
    }

    // Try 'till some script can get anything
    if (!data.empty()) {
      data.emplace("USED_FALLBACK_SCRIPT", script);
      break;
    }
  }

  makefile.RemoveDefinition(result_variable);

  return data;
}